

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

fdb_status
fdb_iterator_sequence_init
          (fdb_kvs_handle *handle,fdb_iterator **ptr_iterator,fdb_seqnum_t start_seq,
          fdb_seqnum_t end_seq,fdb_iterator_opt_t opt)

{
  long lVar1;
  fdb_status fVar2;
  uint uVar3;
  long *plVar4;
  char *pcVar5;
  void *pvVar6;
  wal_item *pwVar7;
  fdb_kvs_id_t **__dest;
  fdb_seqnum_t in_stack_00000160;
  fdb_kvs_handle **in_stack_00000168;
  fdb_kvs_handle *in_stack_00000170;
  size_t sStack_150;
  fdb_kvs_id_t *local_148;
  wal_iterator **in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined1 by_key;
  snap_handle *in_stack_fffffffffffffed0;
  err_log_callback *log_callback;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  int size_chunk;
  fdb_iterator *iterator;
  wal_item_header query_key;
  wal_item query;
  uint8_t *start_seq_kv;
  size_t size_seq;
  size_t size_id;
  fdb_kvs_id_t _kv_id;
  fdb_seqnum_t _start_seq;
  fdb_status fs;
  fdb_iterator_opt_t opt_local;
  fdb_seqnum_t end_seq_local;
  fdb_seqnum_t start_seq_local;
  fdb_iterator **ptr_iterator_local;
  fdb_kvs_handle *handle_local;
  
  by_key = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38);
  __dest = &local_148;
  if (handle == (fdb_kvs_handle *)0x0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
  }
  else if ((ptr_iterator == (fdb_iterator **)0x0) || ((end_seq != 0 && (end_seq < start_seq)))) {
    handle_local._4_4_ = FDB_RESULT_INVALID_ARGS;
  }
  else {
    _kv_id = start_seq >> 0x38 | (start_seq & 0xff000000000000) >> 0x28 |
             (start_seq & 0xff0000000000) >> 0x18 | (start_seq & 0xff00000000) >> 8 |
             (start_seq & 0xff000000) << 8 | (start_seq & 0xff0000) << 0x18 |
             (start_seq & 0xff00) << 0x28 | start_seq << 0x38;
    if ((handle->config).seqtree_opt == '\x01') {
      _start_seq._6_2_ = opt;
      _fs = end_seq;
      end_seq_local = start_seq;
      start_seq_local = (fdb_seqnum_t)ptr_iterator;
      ptr_iterator_local = (fdb_iterator **)handle;
      if (handle->shandle == (snap_handle *)0x0) {
        sStack_150 = 0x16678f;
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
        sStack_150 = 0x166798;
        fdb_sync_db_header((fdb_kvs_handle *)query.shandle);
      }
      sStack_150 = 0x1667b7;
      plVar4 = (long *)calloc(1,0x98);
      if (ptr_iterator_local[0x35] == (fdb_iterator *)0x0) {
        sStack_150 = 0x1667e7;
        fVar2 = fdb_snapshot_open(in_stack_00000170,in_stack_00000168,in_stack_00000160);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          log_callback = (err_log_callback *)(ptr_iterator_local + 0x2d);
          sStack_150 = 0x16681f;
          _start_seq._0_4_ = fVar2;
          pcVar5 = _fdb_kvs_get_name((fdb_kvs_handle *)query.field_12.list_elem_txn.next,
                                     (filemgr *)query.field_12.list_elem_txn.prev);
          fdb_log_impl(log_callback,2,(fdb_status)(ulong)(uint)fVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                       ,"fdb_iterator_sequence_init",0x14a,
                       "Failed to create an sequence iterator instance due to the failure of open operation on the KV Store \'%s\' in a database file \'%s\'"
                       ,pcVar5,ptr_iterator_local[9]->handle);
          return (fdb_status)_start_seq;
        }
        *(undefined1 *)((long)plVar4 + 0x6c) = 0;
        _start_seq._0_4_ = 0;
      }
      else {
        *plVar4 = (long)ptr_iterator_local;
        *(undefined1 *)((long)plVar4 + 0x6c) = 1;
      }
      plVar4[1] = 0;
      plVar4[0xe] = 0;
      plVar4[0xf] = 0;
      *(fdb_iterator_opt_t *)(plVar4 + 0xd) = _start_seq._6_2_;
      plVar4[0x10] = -1;
      plVar4[4] = end_seq_local;
      if (_fs == 0) {
        plVar4[0xc] = -1;
      }
      else {
        plVar4[0xc] = _fs;
      }
      plVar4[10] = end_seq_local;
      plVar4[9] = 0;
      plVar4[0xb] = 0;
      sStack_150 = 0x166984;
      wal_itr_init((filemgr *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   in_stack_fffffffffffffed0,(bool)by_key,in_stack_fffffffffffffec0);
      if (*(long *)(*plVar4 + 0x18) == 0) {
        sStack_150 = 0x166be0;
        pvVar6 = calloc(1,0x68);
        plVar4[2] = (long)pvVar6;
        if (end_seq_local == 0) {
          local_148 = (fdb_kvs_id_t *)0x0;
        }
        else {
          local_148 = &_kv_id;
        }
        sStack_150 = 0x166c4e;
        btree_iterator_init((btree *)in_stack_fffffffffffffed0,(btree_iterator *)plVar4[2],
                            *(void **)(*plVar4 + 0x40));
        sStack_150 = 0x166c81;
        pwVar7 = wal_itr_search_greater
                           ((wal_iterator *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            (wal_item *)in_stack_fffffffffffffed0);
        plVar4[6] = (long)pwVar7;
      }
      else {
        uVar3 = (uint)*(ushort *)(ptr_iterator_local + 0xe);
        lVar1 = -((long)(int)uVar3 + 0x17U & 0xfffffffffffffff0);
        __dest = (fdb_kvs_id_t **)((long)&local_148 + lVar1);
        size_id = *(ulong *)(*(long *)(*plVar4 + 0x18) + 8) >> 0x38 |
                  (*(ulong *)(*(long *)(*plVar4 + 0x18) + 8) & 0xff000000000000) >> 0x28 |
                  (*(ulong *)(*(long *)(*plVar4 + 0x18) + 8) & 0xff0000000000) >> 0x18 |
                  (*(ulong *)(*(long *)(*plVar4 + 0x18) + 8) & 0xff00000000) >> 8 |
                  (*(ulong *)(*(long *)(*plVar4 + 0x18) + 8) & 0xff000000) << 8 |
                  (*(ulong *)(*(long *)(*plVar4 + 0x18) + 8) & 0xff0000) << 0x18 |
                  (*(ulong *)(*(long *)(*plVar4 + 0x18) + 8) & 0xff00) << 0x28 |
                  *(long *)(*(long *)(*plVar4 + 0x18) + 8) << 0x38;
        *(undefined8 *)((long)&sStack_150 + lVar1) = 0x166ae9;
        memcpy(__dest,&size_id,8);
        *(undefined8 *)((long)&sStack_150 + lVar1) = 0x166afe;
        memcpy(&stack0xfffffffffffffec0 + lVar1,&_kv_id,8);
        *(undefined8 *)((long)&sStack_150 + lVar1) = 0x166b0d;
        pvVar6 = calloc(1,0x98);
        plVar4[3] = (long)pvVar6;
        *(undefined8 *)((long)&sStack_150 + lVar1) = 0x166b45;
        hbtrie_iterator_init
                  (*(hbtrie **)(&stack0xfffffffffffffec8 + lVar1),
                   *(hbtrie_iterator **)(&stack0xfffffffffffffec0 + lVar1),*__dest,
                   *(size_t *)((long)&sStack_150 + lVar1));
        *(undefined8 *)((long)&sStack_150 + lVar1) = 0x166b72;
        kvid2buf(*(size_t *)(&stack0xfffffffffffffed0 + lVar1),
                 *(fdb_kvs_id_t *)(&stack0xfffffffffffffec8 + lVar1),
                 *(void **)(&stack0xfffffffffffffec0 + lVar1));
        *(undefined8 *)((long)&sStack_150 + lVar1) = 0x166b8d;
        memcpy((void *)((long)__dest + (long)(int)uVar3),&end_seq_local,8);
        *(undefined8 *)((long)&sStack_150 + lVar1) = 0x166bbe;
        pwVar7 = wal_itr_search_greater
                           (*(wal_iterator **)(&stack0xfffffffffffffed8 + lVar1),
                            *(wal_item **)(&stack0xfffffffffffffed0 + lVar1));
        plVar4[6] = (long)pwVar7;
      }
      if (plVar4[6] != 0) {
        plVar4[7] = plVar4[6];
      }
      plVar4[8] = plVar4[6];
      *(undefined1 *)((long)plVar4 + 0x6a) = 0;
      *(undefined1 *)((long)plVar4 + 0x6b) = 0;
      plVar4[0x11] = 0;
      *(long **)start_seq_local = plVar4;
      *(int *)(*plVar4 + 0x1e0) = *(int *)(*plVar4 + 0x1e0) + 1;
      __dest[-1] = (fdb_kvs_id_t *)0x166d24;
      _start_seq._0_4_ = fdb_iterator_next((fdb_iterator *)*__dest);
      if ((fdb_status)_start_seq == FDB_RESULT_FILE_CORRUPTION) {
        __dest[-1] = (fdb_kvs_id_t *)0x166d39;
        fdb_iterator_close((fdb_iterator *)__dest[2]);
        handle_local._4_4_ = (fdb_status)_start_seq;
      }
      else {
        handle_local._4_4_ = FDB_RESULT_SUCCESS;
      }
    }
    else {
      handle_local._4_4_ = FDB_RESULT_INVALID_CONFIG;
    }
  }
  return handle_local._4_4_;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_sequence_init(fdb_kvs_handle *handle,
                                      fdb_iterator **ptr_iterator,
                                      const fdb_seqnum_t start_seq,
                                      const fdb_seqnum_t end_seq,
                                      fdb_iterator_opt_t opt)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (ptr_iterator == NULL || (end_seq && start_seq > end_seq)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    fdb_status fs;
    fdb_seqnum_t _start_seq = _endian_encode(start_seq);
    fdb_kvs_id_t _kv_id;
    size_t size_id, size_seq;
    uint8_t *start_seq_kv;
    struct wal_item query;
    struct wal_item_header query_key;
    LATENCY_STAT_START();

    query.header = &query_key;

    // Sequence trees are a must for byseq operations
    if (handle->config.seqtree_opt != FDB_SEQTREE_USE) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!handle->shandle) {
        // If compaction is already done before this line,
        // handle->file needs to be replaced with handle->new_file.
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);
    }

    size_id = sizeof(fdb_kvs_id_t);
    size_seq = sizeof(fdb_seqnum_t);
    fdb_iterator *iterator = (fdb_iterator *)calloc(1, sizeof(fdb_iterator));

    if (!handle->shandle) {
        // snapshot handle doesn't exist
        // open a new handle to make the iterator handle as a snapshot
        fs = fdb_snapshot_open(handle, &iterator->handle, FDB_SNAPSHOT_INMEM);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(&handle->log_callback, FDB_LOG_ERROR, fs,
                    "Failed to create an sequence iterator instance due to the "
                    "failure of "
                    "open operation on the KV Store '%s' in a database file '%s'",
                    _fdb_kvs_get_name(handle, handle->file),
                    handle->file->filename);
            return fs;
        }
        iterator->snapshot_handle = false;
    } else {
        // Snapshot handle exists
        // We don't need to open a new handle.. just point to the snapshot handle.
        iterator->handle = handle;
        iterator->snapshot_handle = true;
    }

    iterator->hbtrie_iterator = NULL;
    iterator->_key = NULL;
    iterator->_keylen = 0;
    iterator->opt = opt;
    iterator->_offset = BLK_NOT_FOUND;
    iterator->_seqnum = start_seq;

    // For easy API call, treat zero seq as 0xffff...
    // (because zero seq number is not used)
    if (end_seq == 0) {
        iterator->end_seqnum = SEQNUM_NOT_USED;
    } else {
        iterator->end_seqnum = end_seq;
    }

    iterator->start_seqnum = start_seq;

    iterator->start_key = NULL;
    iterator->end_key = NULL;

    wal_itr_init(handle->file, iterator->handle->shandle, false,
                 &iterator->wal_itr);

    if (iterator->handle->kvs) {
        int size_chunk = handle->config.chunksize;
        // create an iterator handle for hb-trie
        start_seq_kv = alca(uint8_t, size_chunk + size_seq);
        _kv_id = _endian_encode(iterator->handle->kvs->id);
        memcpy(start_seq_kv, &_kv_id, size_id);
        memcpy(start_seq_kv + size_id, &_start_seq, size_seq);

        iterator->seqtrie_iterator = (struct hbtrie_iterator *)
                                     calloc(1, sizeof(struct hbtrie_iterator));
        hbtrie_iterator_init(iterator->handle->seqtrie,
                             iterator->seqtrie_iterator,
                             start_seq_kv, size_id + size_seq);

        query_key.key = start_seq_kv;
        kvid2buf(size_chunk, iterator->handle->kvs->id, start_seq_kv);
        memcpy(start_seq_kv + size_chunk, &start_seq, size_seq);
        query_key.keylen = size_chunk + size_seq;
        query.seqnum = start_seq;
        iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr,
                                                       &query);
    } else {
        // create an iterator handle for b-tree
        iterator->seqtree_iterator = (struct btree_iterator *)
                                     calloc(1, sizeof(struct btree_iterator));
        btree_iterator_init(iterator->handle->seqtree,
                            iterator->seqtree_iterator,
                            (void *)(start_seq ? &_start_seq : NULL));
        query_key.key = (void*)NULL;
        query_key.keylen = 0;
        query.seqnum = start_seq;
        iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr,
                                                       &query);
    }

    // to know reverse iteration endpoint store the start cursor
    if (iterator->tree_cursor) {
        iterator->tree_cursor_start = iterator->tree_cursor;
    }
    iterator->tree_cursor_prev = iterator->tree_cursor;
    iterator->direction = FDB_ITR_DIR_NONE;
    iterator->status = FDB_ITR_IDX;
    iterator->_dhandle = NULL; // populated at the first iterator movement

    *ptr_iterator = iterator;

    ++iterator->handle->num_iterators; // Increment the iterator counter of the KV handle
    fs = fdb_iterator_next(iterator); // position cursor at first key
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_SEQ_INIT);
    if (fs == FDB_RESULT_FILE_CORRUPTION) {
        fdb_iterator_close(iterator);
        return fs;
    }

    return FDB_RESULT_SUCCESS;
}